

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

int lyd_wd_add_leaflist(lyd_node **tree,lyd_node *last_parent,lys_node_leaflist *llist,
                       unres_data *unres,int check_when_must)

{
  lys_tpdf *plVar1;
  int iVar2;
  uint uVar3;
  int local_68;
  int ret;
  int i;
  uint8_t dflt_size;
  char **dflt;
  lys_tpdf *tpdf;
  lyd_node *first;
  lyd_node *current;
  lyd_node *dummy;
  int check_when_must_local;
  unres_data *unres_local;
  lys_node_leaflist *llist_local;
  lyd_node *last_parent_local;
  lyd_node **tree_local;
  
  tpdf = (lys_tpdf *)0x0;
  _i = (char **)0x0;
  ret._3_1_ = 0;
  if (1 < ((byte)llist->module->field_0x40 >> 1 & 7)) {
    if (llist->dflt_size == '\0') {
      if (llist->min == 0) {
        for (dflt = &((llist->type).der)->name; dflt != (char **)0x0; dflt = (char **)dflt[10]) {
          if (dflt[0xf] != (char *)0x0) {
            _i = dflt + 0xf;
            ret._3_1_ = 1;
            break;
          }
        }
      }
    }
    else {
      ret._3_1_ = llist->dflt_size;
      _i = llist->dflt;
    }
    if (ret._3_1_ != 0) {
      for (local_68 = 0; local_68 < (int)(uint)ret._3_1_; local_68 = local_68 + 1) {
        first = lyd_new_dummy(*tree,last_parent,(lys_node *)llist,_i[local_68],1);
        if ((lys_tpdf *)first == (lys_tpdf *)0x0) goto LAB_00193901;
        plVar1 = (lys_tpdf *)first;
        if ((tpdf != (lys_tpdf *)0x0) &&
           (plVar1 = tpdf, (lyd_node *)((lys_tpdf *)first)->units == (lyd_node *)0x0)) {
          tpdf->ext[3] = (lys_ext_instance *)first;
          ((lys_tpdf *)first)->ext = (lys_ext_instance **)tpdf->ext;
          tpdf->ext = (lys_ext_instance **)first;
        }
        while( true ) {
          tpdf = plVar1;
          if ((check_when_must != 0) &&
             ((((((byte)first->field_0x9 >> 1 & 4) != 0 &&
                (iVar2 = unres_data_add(unres,first,UNRES_WHEN), iVar2 == -1)) ||
               ((uVar3 = resolve_applies_must(first), (uVar3 & 1) != 0 &&
                (iVar2 = unres_data_add(unres,first,UNRES_MUST), iVar2 == -1)))) ||
              (((uVar3 & 2) != 0 &&
               (iVar2 = unres_data_add(unres,first,UNRES_MUST_INOUT), iVar2 == -1))))))
          goto LAB_00193901;
          first->validity = first->validity & 0x7f;
          if ((lys_node_leaflist *)first->schema == llist) break;
          first = first->child;
          plVar1 = tpdf;
        }
        if (*(short *)&first[1].validity == 9) {
          iVar2 = unres_data_add(unres,first,UNRES_LEAFREF);
joined_r0x0019388e:
          if (iVar2 != 0) goto LAB_00193901;
        }
        else if (*(short *)&first[1].validity == 8) {
          iVar2 = unres_data_add(unres,first,UNRES_INSTID);
          goto joined_r0x0019388e;
        }
      }
      if (((tpdf == (lys_tpdf *)0x0) || (tpdf->units != (char *)0x0)) || (*tree == (lyd_node *)0x0))
      {
        if (*tree == (lyd_node *)0x0) {
          *tree = (lyd_node *)tpdf;
        }
      }
      else {
        iVar2 = lyd_insert_sibling(tree,(lyd_node *)tpdf);
        if (iVar2 != 0) {
LAB_00193901:
          lyd_free_withsiblings((lyd_node *)tpdf);
          return 1;
        }
      }
      lyd_wd_update_parents((lyd_node *)tpdf);
    }
  }
  return 0;
}

Assistant:

static int
lyd_wd_add_leaflist(struct lyd_node **tree, struct lyd_node *last_parent, struct lys_node_leaflist *llist,
                    struct unres_data *unres, int check_when_must)
{
    struct lyd_node *dummy, *current, *first = NULL;
    struct lys_tpdf *tpdf;
    const char **dflt = NULL;
    uint8_t dflt_size = 0;
    int i, ret;

    if (llist->module->version < 2) {
        /* default values on leaf-lists are allowed from YANG 1.1 */
        return EXIT_SUCCESS;
    }

    /* get know if there is a default value */
    if (llist->dflt_size) {
        /* there are default values */
        dflt_size = llist->dflt_size;
        dflt = llist->dflt;
    } else if (!llist->min) {
        /* get the default value from the type */
        for (tpdf = llist->type.der; tpdf && !dflt; tpdf = tpdf->type.der) {
            if (tpdf->dflt) {
                dflt = &tpdf->dflt;
                dflt_size = 1;
                break;
            }
        }
    }

    if (!dflt_size) {
        /* no default values to use */
        return EXIT_SUCCESS;
    }

    for (i = 0; i < dflt_size; i++) {
        /* create the node */
        if (!(dummy = lyd_new_dummy(*tree, last_parent, (struct lys_node*)llist, dflt[i], 1))) {
            goto error;
        }

        if (!first) {
            first = dummy;
        } else if (!dummy->parent) {
            /* interconnect with the rest of leaf-lists */
            first->prev->next = dummy;
            dummy->prev = first->prev;
            first->prev = dummy;
        }

        for (current = dummy; ; current = current->child) {
            /* remember the created data in unres */
            if (check_when_must) {
                if ((current->when_status & LYD_WHEN) && unres_data_add(unres, current, UNRES_WHEN) == -1) {
                    goto error;
                }
                ret = resolve_applies_must(current);
                if ((ret & 0x1) && (unres_data_add(unres, current, UNRES_MUST) == -1)) {
                    goto error;
                }
                if ((ret & 0x2) && (unres_data_add(unres, current, UNRES_MUST_INOUT) == -1)) {
                    goto error;
                }
            }

            /* clear dummy-node flag */
            current->validity &= ~LYD_VAL_INUSE;

            if (current->schema == (struct lys_node *)llist) {
                break;
            }
        }

        /* if necessary, remember the created data value in unres */
        if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_LEAFREF) {
            if (unres_data_add(unres, current, UNRES_LEAFREF)) {
                goto error;
            }
        } else if (((struct lyd_node_leaf_list *)current)->value_type == LY_TYPE_INST) {
            if (unres_data_add(unres, current, UNRES_INSTID)) {
                goto error;
            }
        }
    }

    /* insert into the tree */
    if (first && !first->parent && (*tree)) {
        /* connect dummy nodes into the data tree (at the end of top level nodes) */
        if (lyd_insert_sibling(tree, first)) {
            goto error;
        }
    } else if (!(*tree)) {
        *tree = first;
    }

    /* update parent's default flag if needed */
    lyd_wd_update_parents(first);

    return EXIT_SUCCESS;

error:
    lyd_free_withsiblings(first);
    return EXIT_FAILURE;
}